

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void RAWToARGBRow_C(uint8_t *src_raw,uint8_t *dst_argb,int width)

{
  uint8_t uVar1;
  uint8_t uVar2;
  long lVar3;
  
  if (0 < width) {
    lVar3 = 0;
    do {
      uVar1 = *src_raw;
      uVar2 = src_raw[1];
      dst_argb[lVar3 * 4] = src_raw[2];
      dst_argb[lVar3 * 4 + 1] = uVar2;
      dst_argb[lVar3 * 4 + 2] = uVar1;
      dst_argb[lVar3 * 4 + 3] = 0xff;
      src_raw = src_raw + 3;
      lVar3 = lVar3 + 1;
    } while (width != (int)lVar3);
  }
  return;
}

Assistant:

void RAWToARGBRow_C(const uint8_t* src_raw, uint8_t* dst_argb, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t r = src_raw[0];
    uint8_t g = src_raw[1];
    uint8_t b = src_raw[2];
    dst_argb[0] = b;
    dst_argb[1] = g;
    dst_argb[2] = r;
    dst_argb[3] = 255u;
    dst_argb += 4;
    src_raw += 3;
  }
}